

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

uint64_t fdb_kvs_header_append(fdb_kvs_handle *handle)

{
  kvs_header *pkVar1;
  filemgr_magic_t magic;
  avl_node *paVar2;
  bid_t offset;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  fdb_status fVar6;
  avl_node *paVar7;
  size_t sVar8;
  ulong *__ptr;
  size_t sVar9;
  bid_t bVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  docio_length doc_len;
  docio_length local_b8;
  pthread_spinlock_t *local_a0;
  fdb_kvs_handle *local_98;
  docio_handle *local_90;
  char local_88 [32];
  docio_object local_68;
  
  local_b8.keylen = 0;
  local_b8.metalen = 0;
  local_b8.bodylen = 0;
  local_b8.bodylen_ondisk = 0;
  local_b8.flag = '\0';
  local_b8.checksum = '\0';
  local_b8.reserved = 0;
  local_90 = handle->dhandle;
  pkVar1 = handle->file->kv_header;
  if (pkVar1 == (kvs_header *)0x0) {
    __ptr = (ulong *)0x0;
    local_68.length.bodylen = 0;
  }
  else {
    magic = handle->file->version;
    local_a0 = &pkVar1->lock;
    pthread_spin_lock(local_a0);
    paVar7 = avl_first(pkVar1->idx_name);
    local_98 = handle;
    if (paVar7 == (avl_node *)0x0) {
      sVar8 = 0x10;
      uVar11 = 0;
    }
    else {
      iVar12 = 0x10;
      uVar11 = 0;
      do {
        uVar11 = uVar11 + 1;
        sVar8 = strlen((char *)paVar7[-7].left);
        bVar3 = ver_is_atleast_magic_001(magic);
        iVar12 = (uint)bVar3 * 0x10 + (int)sVar8 + iVar12 + 0x33;
        paVar7 = avl_next(paVar7);
      } while (paVar7 != (avl_node *)0x0);
      sVar8 = (size_t)iVar12;
    }
    __ptr = (ulong *)malloc(sVar8);
    *__ptr = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
             (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
             (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
             uVar11 << 0x38;
    uVar11 = pkVar1->id_counter;
    __ptr[1] = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
               (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
               (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28
               | uVar11 << 0x38;
    paVar7 = avl_first(pkVar1->idx_name);
    if (paVar7 != (avl_node *)0x0) {
      lVar13 = 0x10;
      do {
        paVar2 = paVar7[-7].left;
        sVar9 = strlen((char *)paVar2);
        uVar5 = (int)sVar9 + 1;
        uVar14 = uVar5 & 0xffff;
        uVar4 = (ushort)uVar5;
        iVar12 = (int)lVar13;
        *(ushort *)((long)__ptr + (long)iVar12) = uVar4 << 8 | uVar4 >> 8;
        memcpy((void *)((long)(iVar12 + 2) + (long)__ptr),paVar2,(ulong)uVar14);
        paVar2 = paVar7[-7].right;
        *(ulong *)((long)__ptr + (long)(int)(iVar12 + uVar14 + 2)) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        paVar2 = paVar7[-6].parent;
        *(ulong *)((long)__ptr + (long)(int)(iVar12 + 10 + uVar14)) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        paVar2 = paVar7[-3].right;
        *(ulong *)((long)__ptr + (long)(int)(iVar12 + 0x12 + uVar14)) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        paVar2 = paVar7[-2].parent;
        *(ulong *)((long)__ptr + (long)(int)(iVar12 + 0x1a + uVar14)) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        paVar2 = paVar7[-2].right;
        *(ulong *)((long)__ptr + (long)(int)(iVar12 + 0x22 + uVar14)) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        paVar2 = paVar7[-6].left;
        lVar13 = (long)(int)(iVar12 + uVar14 + 0x2a);
        *(ulong *)((long)__ptr + lVar13) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        lVar13 = lVar13 + 8;
        bVar3 = ver_is_atleast_magic_001(magic);
        if (bVar3) {
          paVar2 = paVar7[-1].right;
          *(ulong *)((long)__ptr + (long)(int)lVar13) =
               (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
               ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
               ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
               ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
          paVar2 = paVar7[-2].left;
          lVar13 = (long)(int)(iVar12 + uVar14 + 0x3a);
          *(ulong *)((long)__ptr + lVar13) =
               (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
               ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
               ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
               ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
          lVar13 = lVar13 + 8;
        }
        paVar7 = avl_next(paVar7);
      } while (paVar7 != (avl_node *)0x0);
    }
    pthread_spin_unlock(local_a0);
    local_68.length.bodylen = (uint32_t)sVar8;
    handle = local_98;
  }
  offset = handle->kv_info_offset;
  local_68.length.bodylen_ondisk = 0;
  local_68.length.flag = '\0';
  local_68.length.checksum = '\0';
  local_68.length.reserved = 0;
  local_68.timestamp = 0;
  local_68._20_4_ = 0;
  local_68.key = local_88;
  builtin_strncpy(local_88,"KV_header",10);
  local_68.meta = (void *)0x0;
  local_68.body = __ptr;
  sVar8 = strlen((char *)local_68.key);
  local_68.length.keylen = (short)sVar8 + 1;
  local_68.length.metalen = 0;
  local_68.field_3.seqnum = 0;
  bVar10 = docio_append_doc_system(local_90,&local_68);
  free(__ptr);
  if (offset != 0xffffffffffffffff) {
    fVar6 = docio_read_doc_length(handle->dhandle,&local_b8,offset);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      filemgr_mark_stale(handle->file,offset,
                         (ulong)((local_b8._0_4_ & 0xffff) + ((uint)local_b8._0_4_ >> 0x10) +
                                local_b8.bodylen_ondisk) + 0x20);
    }
  }
  return bVar10;
}

Assistant:

uint64_t fdb_kvs_header_append(fdb_kvs_handle *handle)
{
    char *doc_key = alca(char, 32);
    void *data;
    size_t len;
    uint64_t kv_info_offset, prev_offset;
    struct docio_object doc;
    struct docio_length doc_len;
    struct filemgr *file = handle->file;
    struct docio_handle *dhandle = handle->dhandle;

    _fdb_kvs_header_export(file->kv_header, &data, &len, file->version);

    prev_offset = handle->kv_info_offset;

    memset(&doc, 0, sizeof(struct docio_object));
    sprintf(doc_key, "KV_header");
    doc.key = (void *)doc_key;
    doc.meta = NULL;
    doc.body = data;
    doc.length.keylen = strlen(doc_key) + 1;
    doc.length.metalen = 0;
    doc.length.bodylen = len;
    doc.seqnum = 0;
    kv_info_offset = docio_append_doc_system(dhandle, &doc);
    free(data);

    if (prev_offset != BLK_NOT_FOUND) {
        if (docio_read_doc_length(handle->dhandle, &doc_len, prev_offset)
            == FDB_RESULT_SUCCESS) {
            // mark stale
            filemgr_mark_stale(handle->file, prev_offset, _fdb_get_docsize(doc_len));
        }
    }

    return kv_info_offset;
}